

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2point_compression.cc
# Opt level: O0

void anon_unknown.dwarf_39b09c::EncodeFirstPointFixedLength
               (pair<int,_int> *vertex_pi_qi,int level,NthDerivativeCoder *pi_coder,
               NthDerivativeCoder *qi_coder,Encoder *encoder)

{
  int iVar1;
  uint64 uStack_48;
  int bytes_required;
  uint64 little_endian_interleaved_pi_qi;
  uint64 interleaved_pi_qi;
  uint32 qi;
  uint32 pi;
  Encoder *encoder_local;
  NthDerivativeCoder *qi_coder_local;
  NthDerivativeCoder *pi_coder_local;
  pair<int,_int> *ppStack_10;
  int level_local;
  pair<int,_int> *vertex_pi_qi_local;
  
  _qi = encoder;
  encoder_local = (Encoder *)qi_coder;
  qi_coder_local = pi_coder;
  pi_coder_local._4_4_ = level;
  ppStack_10 = vertex_pi_qi;
  interleaved_pi_qi._4_4_ = NthDerivativeCoder::Encode(pi_coder,vertex_pi_qi->first);
  interleaved_pi_qi._0_4_ =
       NthDerivativeCoder::Encode((NthDerivativeCoder *)encoder_local,ppStack_10->second);
  little_endian_interleaved_pi_qi =
       util_bits::InterleaveUint32(interleaved_pi_qi._4_4_,(uint32)interleaved_pi_qi);
  uStack_48 = LittleEndian::FromHost64(little_endian_interleaved_pi_qi);
  iVar1 = (pi_coder_local._4_4_ + 7) / 8 << 1;
  Encoder::Ensure(_qi,(long)iVar1);
  Encoder::putn(_qi,&stack0xffffffffffffffb8,(long)iVar1);
  Encoder::avail(_qi);
  return;
}

Assistant:

void EncodeFirstPointFixedLength(const pair<int, int>& vertex_pi_qi,
                                 int level,
                                 NthDerivativeCoder* pi_coder,
                                 NthDerivativeCoder* qi_coder,
                                 Encoder* encoder) {
  // Do not ZigZagEncode the first point, since it cannot be negative.
  const uint32 pi = pi_coder->Encode(vertex_pi_qi.first);
  const uint32 qi = qi_coder->Encode(vertex_pi_qi.second);
  // Interleave to reduce overhead from two partial bytes to one.
  const uint64 interleaved_pi_qi = util_bits::InterleaveUint32(pi, qi);

  // Convert to little endian for architecture independence.
  const uint64 little_endian_interleaved_pi_qi =
      LittleEndian::FromHost64(interleaved_pi_qi);

  const int bytes_required = (level + 7) / 8 * 2;
  encoder->Ensure(bytes_required);
  encoder->putn(&little_endian_interleaved_pi_qi, bytes_required);
  S2_DCHECK_GE(encoder->avail(), 0);
}